

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bonk~.c
# Opt level: O0

void bonk_write(t_bonk *x,t_symbol *s)

{
  float *local_420;
  t_float *fp;
  t_template_conflict *tp;
  int ntemplate;
  int i;
  char buf [1000];
  FILE *fd;
  t_symbol *s_local;
  t_bonk *x_local;
  
  tp._0_4_ = x->x_ntemplate;
  fp = x->x_template->t_amp;
  canvas_makefilename(x->x_canvas,s->s_name,(char *)&ntemplate,1000);
  sys_bashfilename((char *)&ntemplate,(char *)&ntemplate);
  buf._992_8_ = fopen((char *)&ntemplate,"w");
  if ((FILE *)buf._992_8_ == (FILE *)0x0) {
    post("%s: couldn\'t create",s->s_name);
  }
  else {
    while ((int)tp != 0) {
      local_420 = fp;
      tp._4_4_ = x->x_nfilters;
      while (tp._4_4_ != 0) {
        fprintf((FILE *)buf._992_8_,"%6.2f ",(double)*local_420);
        local_420 = local_420 + 1;
        tp._4_4_ = tp._4_4_ + -1;
      }
      fprintf((FILE *)buf._992_8_,"\n");
      fp = fp + 200;
      tp._0_4_ = (int)tp + -1;
    }
    post("bonk: wrote %d templates\n",(ulong)(uint)x->x_ntemplate);
    fclose((FILE *)buf._992_8_);
  }
  return;
}

Assistant:

static void bonk_write(t_bonk *x, t_symbol *s)
{
    FILE *fd;
    char buf[MAXPDSTRING]; /* fbar */
    int i, ntemplate = x->x_ntemplate;
    t_template *tp = x->x_template;
    t_float *fp;
    
    /* fbar: canvas-code as in g_array.c */
    canvas_makefilename(x->x_canvas, s->s_name,
        buf, MAXPDSTRING);
    sys_bashfilename(buf, buf);

    if (!(fd = fopen(buf, "w")))
    {
        post("%s: couldn't create", s->s_name);
        return;
    }
    for (; ntemplate--; tp++)
    {
        for (i = x->x_nfilters, fp = tp->t_amp; i--; fp++)
            fprintf(fd, "%6.2f ", *fp);
        fprintf(fd, "\n");
    }
    post("bonk: wrote %d templates\n", x->x_ntemplate);
    fclose(fd);
}